

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O0

upb_MessageValue upb_FieldDef_Default(upb_FieldDef *f)

{
  undefined8 *puVar1;
  upb_MessageValue uVar2;
  _Bool _Var3;
  upb_CType uVar4;
  str_t *str;
  upb_MessageValue ret;
  upb_FieldDef *f_local;
  undefined8 local_10;
  
  _Var3 = upb_FieldDef_IsRepeated(f);
  if ((_Var3) || (_Var3 = upb_FieldDef_IsSubMessage(f), _Var3)) {
    f_local._0_4_ = 0.0;
    f_local._4_4_ = 0;
  }
  else {
    uVar4 = upb_FieldDef_CType(f);
    switch(uVar4) {
    case kUpb_CType_Bool:
      f_local._0_4_ = (float)(CONCAT31(f_local._1_3_,(f->defaultval).boolean) & 0xffffff01);
      break;
    case kUpb_CType_Float:
      f_local._0_4_ = (f->defaultval).flt;
      break;
    case kUpb_CType_Int32:
    case kUpb_CType_Enum:
      f_local._0_4_ = (f->defaultval).flt;
      break;
    case kUpb_CType_UInt32:
      f_local._0_4_ = (f->defaultval).flt;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/reflection/field_def.c"
                    ,0xcc,"upb_MessageValue upb_FieldDef_Default(const upb_FieldDef *)");
    case kUpb_CType_Double:
      f_local._0_4_ = (f->defaultval).flt;
      f_local._4_4_ = (undefined4)((ulong)f->defaultval >> 0x20);
      break;
    case kUpb_CType_Int64:
      f_local._0_4_ = (f->defaultval).flt;
      f_local._4_4_ = (undefined4)((ulong)f->defaultval >> 0x20);
      break;
    case kUpb_CType_UInt64:
      f_local._0_4_ = (f->defaultval).flt;
      f_local._4_4_ = (undefined4)((ulong)f->defaultval >> 0x20);
      break;
    case kUpb_CType_String:
    case kUpb_CType_Bytes:
      puVar1 = (undefined8 *)(f->defaultval).msg;
      if (puVar1 == (undefined8 *)0x0) {
        f_local._0_4_ = 0.0;
        f_local._4_4_ = 0;
        local_10 = 0;
      }
      else {
        f_local._0_4_ = SUB84(puVar1 + 1,0);
        f_local._4_4_ = (undefined4)((ulong)(puVar1 + 1) >> 0x20);
        local_10 = *puVar1;
      }
    }
  }
  uVar2.int64_val._4_4_ = f_local._4_4_;
  uVar2.float_val = f_local._0_4_;
  uVar2.str_val.size = local_10;
  return uVar2;
}

Assistant:

upb_MessageValue upb_FieldDef_Default(const upb_FieldDef* f) {
  upb_MessageValue ret;

  if (upb_FieldDef_IsRepeated(f) || upb_FieldDef_IsSubMessage(f)) {
    return (upb_MessageValue){.msg_val = NULL};
  }

  switch (upb_FieldDef_CType(f)) {
    case kUpb_CType_Bool:
      return (upb_MessageValue){.bool_val = f->defaultval.boolean};
    case kUpb_CType_Int64:
      return (upb_MessageValue){.int64_val = f->defaultval.sint};
    case kUpb_CType_UInt64:
      return (upb_MessageValue){.uint64_val = f->defaultval.uint};
    case kUpb_CType_Enum:
    case kUpb_CType_Int32:
      return (upb_MessageValue){.int32_val = (int32_t)f->defaultval.sint};
    case kUpb_CType_UInt32:
      return (upb_MessageValue){.uint32_val = (uint32_t)f->defaultval.uint};
    case kUpb_CType_Float:
      return (upb_MessageValue){.float_val = f->defaultval.flt};
    case kUpb_CType_Double:
      return (upb_MessageValue){.double_val = f->defaultval.dbl};
    case kUpb_CType_String:
    case kUpb_CType_Bytes: {
      str_t* str = f->defaultval.str;
      if (str) {
        return (upb_MessageValue){
            .str_val = (upb_StringView){.data = str->str, .size = str->len}};
      } else {
        return (upb_MessageValue){
            .str_val = (upb_StringView){.data = NULL, .size = 0}};
      }
    }
    default:
      UPB_UNREACHABLE();
  }

  return ret;
}